

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O2

int gpioSetGetSamplesFunc(gpioGetSamplesFunc_t f,uint32_t bits)

{
  FILE *pFVar1;
  uint uVar2;
  
  pFVar1 = _stderr;
  if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals >> 10 & 1) == 0)) {
    myTimeStamp();
    fprintf(pFVar1,"%s %s: function=%08X bits=%08X\n",myTimeStamp::buf,"gpioSetGetSamplesFunc",
            (ulong)f & 0xffffffff,bits);
  }
  pFVar1 = _stderr;
  if (libInitialised == '\0') {
    uVar2 = 0xffffffe1;
    if ((gpioCfg.internals >> 10 & 1) == 0) {
      myTimeStamp();
      fprintf(pFVar1,"%s %s: pigpio uninitialised, call gpioInitialise()\n",myTimeStamp::buf,
              "gpioSetGetSamplesFunc");
    }
  }
  else {
    gpioGetSamples_1 = 0;
    gpioGetSamples_2 = 0;
    uVar2 = 0;
    gpioGetSamples_3 = bits;
    if (f == (gpioGetSamplesFunc_t)0x0) {
      gpioGetSamples_3 = uVar2;
    }
    monitorBits = alertBits | notifyBits | scriptBits | gpioGetSamples_3;
    gpioGetSamples_0 = f;
  }
  return uVar2;
}

Assistant:

int gpioSetGetSamplesFunc(gpioGetSamplesFunc_t f, uint32_t bits)
{
   DBG(DBG_USER, "function=%08X bits=%08X", (uint32_t)f, bits);

   CHECK_INITED;

   gpioGetSamples.ex       = 0;
   gpioGetSamples.userdata = NULL;
   gpioGetSamples.func     = f;

   if (f) gpioGetSamples.bits = bits;
   else   gpioGetSamples.bits = 0;

   monitorBits = alertBits | notifyBits | scriptBits | gpioGetSamples.bits;

   return 0;
}